

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O0

size_t util::findLast(string *in,char c)

{
  size_t sVar1;
  char in_SIL;
  char in_DIL;
  size_type npos;
  size_type pos;
  size_t local_18;
  
  sVar1 = std::__cxx11::string::find(in_DIL,0x5f);
  do {
    local_18 = sVar1;
    if (local_18 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    sVar1 = std::__cxx11::string::find(in_DIL,(ulong)(uint)(int)in_SIL);
  } while (sVar1 != 0xffffffffffffffff);
  return local_18;
}

Assistant:

size_t findLast(const std::string& in, char c) {
  auto pos = in.find('_');
  while (pos != std::string::npos) {
    auto npos = in.find(c, pos + 1);
    if (npos == std::string::npos) {
      break;
    }
    pos = npos;
  }
  return pos;
}